

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void hsubpd_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x6001d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"hsubpd",7);
    }
    else {
      if ((pMyDisasm->Reserved_).PrefRepne != 1) goto LAB_0011d811;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x6001d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"hsubps",7);
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    return;
  }
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x03') {
      uVar2 = 0x73706275736876;
    }
    else {
      if (UVar1 != '\x01') goto LAB_0011d811;
      uVar2 = 0x64706275736876;
    }
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar2;
    ArgsVEX(pMyDisasm);
    return;
  }
LAB_0011d811:
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ hsubpd_VW(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.EVEX.state == InUsePrefix) {
     failDecode(pMyDisasm);
   }
   else {
     if (GV.VEX.pp == 0x1) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vhsubpd");
       #endif
       ArgsVEX(pMyDisasm);
     }
     else if (GV.VEX.pp == 0x3){
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vhsubps");
       #endif
       ArgsVEX(pMyDisasm);
     }
     else {
       failDecode(pMyDisasm);
     }
   }

 }
 else {
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+SIMD_FP_HORIZONTAL;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "hsubpd");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else if (GV.PrefRepne == 1){
     /* 0xF2 */
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+SIMD_FP_HORIZONTAL;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "hsubps");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else {
     failDecode(pMyDisasm);
   }
 }
}